

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::start(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
        *this,environment_t *env)

{
  int iVar1;
  outliving_reference_t<so_5::stats::repository_t> local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar1 == 0) {
    local_20.m_ptr = environment_t::stats_repository(env);
    stats::manually_registered_source_t::start
              (&(this->m_data_source).super_manually_registered_source_t,&local_20);
    this->m_shutdown_started = false;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

virtual void
		start( so_5::environment_t & env ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				m_data_source.start( outliving_mutable(env.stats_repository()) );

				so_5::details::do_with_rollback_on_exception(
					[this] {
						// do_with_rollback_on_exception is used in this simple case
						// just for simplification of extension of that block
						// in the future.
						m_shutdown_started = false;
					},
					[this] { m_data_source.stop(); } );
			}